

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_mesh.hpp
# Opt level: O2

int __thiscall
sisl::utility::ply_mesh::add_triangle(ply_mesh *this,vertex3 *v1,vertex3 *v2,vertex3 *v3)

{
  value_type local_2c;
  
  local_2c.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       add_vertex(this,v1);
  local_2c.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = add_vertex(this,v2);
  local_2c.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
       (_Head_base<2UL,_int,_false>)add_vertex(this,v3);
  std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::push_back
            (&this->faces,&local_2c);
  return (int)(((long)(this->faces).
                      super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->faces).
                     super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xc) + -1;
}

Assistant:

int add_triangle(vertex3 v1, vertex3 v2, vertex3 v3) {
            std::tuple<int,int,int> f;

            #pragma omp critical (add_face)
            {
                std::get<0>(f) = add_vertex(v1);
                std::get<1>(f) = add_vertex(v2);
                std::get<2>(f) = add_vertex(v3);

                faces.push_back(f);
            }
            return int(faces.size())-1;
        }